

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglversionprofile.cpp
# Opt level: O2

QDebug operator<<(QDebug debug,QOpenGLVersionProfile *vp)

{
  long lVar1;
  int *piVar2;
  QOpenGLVersionProfilePrivate *pQVar3;
  QDebug *pQVar4;
  long *in_RDX;
  long in_FS_OFFSET;
  QDebug local_40;
  undefined1 local_38 [8];
  QDebugStateSaver saver;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  _saver = &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver(&saver,(QDebug *)vp);
  *(undefined1 *)&vp->d[4].majorVersion = 0;
  QDebug::operator<<((QDebug *)vp,"QOpenGLVersionProfile(");
  piVar2 = (int *)*in_RDX;
  if ((*piVar2 < 1) || (piVar2[1] < 0)) {
    QDebug::operator<<((QDebug *)vp,"invalid");
  }
  else {
    pQVar4 = QDebug::operator<<((QDebug *)vp,*piVar2);
    pQVar4 = QDebug::operator<<(pQVar4,'.');
    pQVar4 = QDebug::operator<<(pQVar4,*(int *)(*in_RDX + 4));
    pQVar4 = QDebug::operator<<(pQVar4,", profile=");
    local_40.stream = pQVar4->stream;
    *(int *)(local_40.stream + 0x28) = *(int *)(local_40.stream + 0x28) + 1;
    operator<<((Stream *)local_38,(OpenGLContextProfile)&local_40);
    QDebug::~QDebug((QDebug *)local_38);
    QDebug::~QDebug(&local_40);
  }
  QDebug::operator<<((QDebug *)vp,')');
  pQVar3 = vp->d;
  vp->d = (QOpenGLVersionProfilePrivate *)0x0;
  *(QOpenGLVersionProfilePrivate **)debug.stream = pQVar3;
  QDebugStateSaver::~QDebugStateSaver(&saver);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (QDebug)debug.stream;
  }
  __stack_chk_fail();
}

Assistant:

QDebug operator<<(QDebug debug, const QOpenGLVersionProfile &vp)
{
    QDebugStateSaver saver(debug);
    debug.nospace();
    debug << "QOpenGLVersionProfile(";
    if (vp.isValid()) {
        debug << vp.version().first << '.' << vp.version().second
            << ", profile=" << vp.profile();
    } else {
        debug << "invalid";
    }
    debug << ')';
    return debug;
}